

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O2

void cpp_wrapper_setup(planck_unit_test_t *tc,Dictionary<int,_int> *dict,
                      ion_behaviour_fill_level_e fill_level)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  switch(fill_level) {
  case ion_fill_edge_cases:
    iVar3 = -300;
    for (iVar1 = -100; iVar1 < -0x32; iVar1 = iVar1 + 2) {
      cpp_wrapper_insert(tc,dict,iVar1,iVar3,'\x01');
      iVar3 = iVar3 + 6;
    }
  case ion_fill_high:
    iVar1 = 5000;
    for (uVar2 = 500; uVar2 < 1000; uVar2 = uVar2 + 5) {
      cpp_wrapper_insert(tc,dict,uVar2,iVar1,'\x01');
      iVar1 = iVar1 + 0x32;
    }
  case ion_fill_medium:
    iVar1 = 0xfa;
    for (uVar2 = 0x32; uVar2 < 100; uVar2 = uVar2 + 2) {
      cpp_wrapper_insert(tc,dict,uVar2,iVar1,'\x01');
      iVar1 = iVar1 + 10;
    }
  case ion_fill_low:
    iVar1 = 0;
    for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
      cpp_wrapper_insert(tc,dict,iVar3,iVar1,'\x01');
      iVar1 = iVar1 + 2;
    }
    return;
  default:
    return;
  }
}

Assistant:

void
cpp_wrapper_setup(
	planck_unit_test_t *tc,
	Dictionary<int, int>			*dict,
	ion_behaviour_fill_level_e fill_level
) {
	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 3, boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 10, boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 2, boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}